

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

CAmount __thiscall wallet::SelectionResult::GetSelectedEffectiveValue(SelectionResult *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar3 = 0;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header)
    {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return lVar3 + this->bump_fee_group_discount;
      }
      __stack_chk_fail();
    }
    if ((char)(*(long **)(p_Var2 + 1))[1] == '\0') break;
    lVar3 = lVar3 + **(long **)(p_Var2 + 1);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
  }
  __assert_fail("effective_value.has_value()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
}

Assistant:

CAmount SelectionResult::GetSelectedEffectiveValue() const
{
    return std::accumulate(m_selected_inputs.cbegin(), m_selected_inputs.cend(), CAmount{0}, [](CAmount sum, const auto& coin) { return sum + coin->GetEffectiveValue(); }) + bump_fee_group_discount;
}